

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomFiveAction.cpp
# Opt level: O1

ActionResults * __thiscall WhiteRoomFiveAction::Pick(WhiteRoomFiveAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ActionResults *this_00;
  ItemWrapper *pIVar3;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  itemType local_5c;
  string local_58;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == BOWL) {
    this_00 = (ActionResults *)operator_new(0x30);
    paVar5 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"You can\'t pick it up. It\'s stuck to the table!","");
    ActionResults::ActionResults(this_00,CURRENT,&local_38);
    _Var4._M_p = local_38._M_dataplus._M_p;
LAB_00125a27:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != paVar5) {
      operator_delete(_Var4._M_p);
    }
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == PITCHER) {
      local_5c = PITCHER;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_5c);
      iVar2 = ItemWrapper::getLocation(pIVar3);
      if (iVar2 != BACKPACK) {
        local_5c = PITCHER;
        pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_5c);
        ItemWrapper::setLocation(pIVar3,BACKPACK);
        this_00 = (ActionResults *)operator_new(0x30);
        paVar5 = &local_58.field_2;
        local_58._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   "Cool... you can use this at your next party. It seems to be carrying some unknown, dark liquid."
                   ,"");
        ActionResults::ActionResults(this_00,CURRENT,&local_58);
        _Var4._M_p = local_58._M_dataplus._M_p;
        goto LAB_00125a27;
      }
    }
    this_00 = AbstractRoomAction::Pick(&this->super_AbstractRoomAction);
  }
  return this_00;
}

Assistant:

ActionResults *WhiteRoomFiveAction::Pick() {
    if(commands->getMainItem() == BOWL) {
        return new ActionResults(CURRENT, "You can't pick it up. It's stuck to the table!");
    }
    else if(commands->getMainItem() == PITCHER && itemList->getValue(PITCHER)->getLocation() != BACKPACK){
        itemList->getValue(PITCHER)->setLocation(BACKPACK);
        return new ActionResults(CURRENT, "Cool... you can use this at your next party. It seems to be carrying some unknown, dark liquid.");
    }
    else {
        return AbstractRoomAction::Pick();
    }
}